

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

void Ppmd7_EncodeSymbol(CPpmd7 *p,CPpmd7z_RangeEnc *rc,int symbol)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  Byte *pBVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  CPpmd_See *pCVar10;
  uint uVar11;
  CPpmd7_Context *pCVar12;
  byte *pbVar13;
  UInt32 UVar14;
  UInt32 UVar15;
  uint uVar16;
  byte *pbVar17;
  ulong uVar18;
  int iVar19;
  UInt16 *pUVar20;
  UInt32 escFreq;
  size_t charMask [32];
  UInt32 local_144;
  CPpmd7_Context *local_140;
  byte local_138 [264];
  
  pCVar12 = p->MinContext;
  uVar5 = pCVar12->NumStats;
  if (uVar5 == 1) {
    bVar1 = *(byte *)((long)&pCVar12->SummFreq + 1);
    bVar2 = p->NS2BSIndx[(ulong)*(ushort *)(p->Base + pCVar12->Suffix) - 1];
    bVar3 = p->HB2Flag[p->FoundState->Symbol];
    p->HiBitsFlag = (uint)bVar3;
    bVar4 = (byte)pCVar12->SummFreq;
    uVar18 = (ulong)bVar4;
    uVar8 = p->RunLength;
    pUVar20 = p->BinSumm[(ulong)bVar1 - 1] +
              ((uVar8 >> 0x1a & 0xffffffe0) +
              (uint)bVar2 + p->PrevSuccess + (uint)bVar3 + (uint)p->HB2Flag[uVar18] * 2);
    uVar11 = (uint)*pUVar20;
    uVar16 = (rc->Range >> 0xe) * uVar11;
    uVar9 = (ulong)uVar16;
    if ((uint)bVar4 == symbol) {
      rc->Range = uVar16;
      if (uVar16 < 0x1000000) {
        do {
          rc->Range = (int)uVar9 << 8;
          RangeEnc_ShiftLow(rc);
          uVar9 = (ulong)rc->Range;
        } while (rc->Range < 0x1000000);
        uVar11 = (uint)*pUVar20;
        bVar1 = *(byte *)((long)&pCVar12->SummFreq + 1);
        uVar8 = p->RunLength;
      }
      *pUVar20 = ((short)uVar11 - (short)(uVar11 + 0x20 >> 7)) + 0x80;
      p->FoundState = (CPpmd_State *)&pCVar12->SummFreq;
      *(byte *)((long)&pCVar12->SummFreq + 1) = bVar1 - ((char)~bVar1 >> 7);
      p->PrevSuccess = 1;
      p->RunLength = uVar8 + 1;
      NextContext(p);
    }
    else {
      rc->Low = rc->Low + uVar9;
      uVar16 = rc->Range - uVar16;
      rc->Range = uVar16;
      if (uVar16 < 0x1000000) {
        do {
          rc->Range = uVar16 << 8;
          RangeEnc_ShiftLow(rc);
          uVar16 = rc->Range;
        } while (uVar16 < 0x1000000);
        uVar11 = (uint)*pUVar20;
        uVar18 = (ulong)(byte)pCVar12->SummFreq;
      }
      uVar11 = uVar11 - (uVar11 + 0x20 >> 7);
      *pUVar20 = (ushort)uVar11;
      p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                         [(uVar11 & 0xffff) >> 10];
      memset(local_138,0xff,0x100);
      local_138[uVar18] = 0;
      p->PrevSuccess = 0;
    }
    if ((uint)bVar4 == symbol) {
      return;
    }
  }
  else {
    pBVar6 = p->Base;
    uVar9 = (ulong)pCVar12->Stats;
    if ((uint)pBVar6[uVar9] == symbol) {
      RangeEnc_Encode(rc,0,(uint)((CPpmd_State *)(pBVar6 + uVar9))->Freq,(uint)pCVar12->SummFreq);
      p->FoundState = (CPpmd_State *)(pBVar6 + uVar9);
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    pbVar13 = pBVar6 + (uVar9 - 6);
    UVar14 = (UInt32)pBVar6[uVar9 + 1];
    iVar19 = uVar5 - 1;
    iVar7 = iVar19;
    do {
      bVar2 = pbVar13[0xc];
      if ((uint)bVar2 == symbol) {
        RangeEnc_Encode(rc,UVar14,(uint)pbVar13[0xd],(uint)pCVar12->SummFreq);
        p->FoundState = (CPpmd_State *)(pbVar13 + 0xc);
        Ppmd7_Update1(p);
        return;
      }
      UVar14 = UVar14 + pbVar13[0xd];
      pbVar13 = pbVar13 + 6;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    p->HiBitsFlag = (uint)p->HB2Flag[p->FoundState->Symbol];
    local_140 = pCVar12;
    memset(local_138,0xff,0x100);
    local_138[bVar2] = 0;
    do {
      local_138[*pbVar13] = 0;
      pbVar13 = pbVar13 + -6;
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
    RangeEnc_Encode(rc,UVar14,local_140->SummFreq - UVar14,(uint)local_140->SummFreq);
  }
  do {
    pCVar12 = p->MinContext;
    uVar5 = pCVar12->NumStats;
    uVar8 = p->OrderFall;
    do {
      uVar9 = (ulong)pCVar12->Suffix;
      if (uVar9 == 0) {
        p->OrderFall = uVar8 + 1;
        return;
      }
      pCVar12 = (CPpmd7_Context *)(p->Base + uVar9);
      p->MinContext = pCVar12;
      uVar8 = uVar8 + 1;
    } while (*(ushort *)(p->Base + uVar9) == uVar5);
    p->OrderFall = uVar8;
    pCVar10 = Ppmd7_MakeEscFreq(p,(uint)uVar5,&local_144);
    uVar8 = (uint)p->MinContext->NumStats;
    pbVar13 = p->Base + (ulong)p->MinContext->Stats + 1;
    UVar14 = 0;
    do {
      bVar2 = pbVar13[-1];
      if ((uint)bVar2 == symbol) {
        uVar16 = 0;
        pbVar17 = pbVar13;
        UVar15 = UVar14;
        do {
          UVar15 = UVar15 + (local_138[pbVar17[-1]] & *pbVar17);
          pbVar17 = pbVar17 + 6;
          uVar16 = uVar16 + 1;
        } while (uVar8 != uVar16);
        RangeEnc_Encode(rc,UVar14,(uint)*pbVar13,local_144 + UVar15);
        bVar2 = pCVar10->Shift;
        if (bVar2 < 7) {
          pBVar6 = &pCVar10->Count;
          *pBVar6 = *pBVar6 + 0xff;
          if (*pBVar6 == '\0') {
            pCVar10->Summ = pCVar10->Summ << 1;
            pCVar10->Shift = bVar2 + 1;
            pCVar10->Count = (Byte)(3 << (bVar2 & 0x1f));
          }
        }
        p->FoundState = (CPpmd_State *)(pbVar13 + -1);
        Ppmd7_Update2(p);
        return;
      }
      UVar14 = UVar14 + (local_138[bVar2] & *pbVar13);
      local_138[bVar2] = 0;
      pbVar13 = pbVar13 + 6;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    UVar15 = local_144 + UVar14;
    RangeEnc_Encode(rc,UVar14,local_144,UVar15);
    pCVar10->Summ = pCVar10->Summ + (short)UVar15;
  } while( true );
}

Assistant:

static void Ppmd7_EncodeSymbol(CPpmd7 *p, CPpmd7z_RangeEnc *rc, int symbol)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    UInt32 sum;
    unsigned i;
    if (s->Symbol == symbol)
    {
      RangeEnc_Encode(rc, 0, s->Freq, p->MinContext->SummFreq);
      p->FoundState = s;
      Ppmd7_Update1_0(p);
      return;
    }
    p->PrevSuccess = 0;
    sum = s->Freq;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((++s)->Symbol == symbol)
      {
        RangeEnc_Encode(rc, sum, s->Freq, p->MinContext->SummFreq);
        p->FoundState = s;
        Ppmd7_Update1(p);
        return;
      }
      sum += s->Freq;
    }
    while (--i);
    
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
    RangeEnc_Encode(rc, sum, p->MinContext->SummFreq - sum, p->MinContext->SummFreq);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    CPpmd_State *s = Ppmd7Context_OneState(p->MinContext);
    if (s->Symbol == symbol)
    {
      RangeEnc_EncodeBit_0(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      p->FoundState = s;
      Ppmd7_UpdateBin(p);
      return;
    }
    else
    {
      RangeEnc_EncodeBit_1(rc, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
      p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
      PPMD_SetAllBitsIn256Bytes(charMask);
      MASK(s->Symbol) = 0;
      p->PrevSuccess = 0;
    }
  }
  for (;;)
  {
    UInt32 escFreq;
    CPpmd_See *see;
    CPpmd_State *s;
    UInt32 sum;
    unsigned i, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return; /* EndMarker (symbol = -1) */
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    
    see = Ppmd7_MakeEscFreq(p, numMasked, &escFreq);
    s = Ppmd7_GetStats(p, p->MinContext);
    sum = 0;
    i = p->MinContext->NumStats;
    do
    {
      int cur = s->Symbol;
      if (cur == symbol)
      {
        UInt32 low = sum;
        CPpmd_State *s1 = s;
        do
        {
          sum += (s->Freq & (int)(MASK(s->Symbol)));
          s++;
        }
        while (--i);
        RangeEnc_Encode(rc, low, s1->Freq, sum + escFreq);
        Ppmd_See_Update(see);
        p->FoundState = s1;
        Ppmd7_Update2(p);
        return;
      }
      sum += (s->Freq & (int)(MASK(cur)));
      MASK(cur) = 0;
      s++;
    }
    while (--i);
    
    RangeEnc_Encode(rc, sum, escFreq, sum + escFreq);
    see->Summ = (UInt16)(see->Summ + sum + escFreq);
  }
}